

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int get_message(mg_connection *conn,char *ebuf,size_t ebuf_len,int *err)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  char *__nptr;
  char *pcVar5;
  double dVar6;
  timespec local_48;
  
  if (ebuf_len != 0) {
    *ebuf = '\0';
  }
  *err = 0;
  if (conn == (mg_connection *)0x0) {
    mg_snprintf((mg_connection *)0x0,(int *)0x0,ebuf,ebuf_len,"%s","Internal error");
    iVar4 = 500;
  }
  else {
    conn->consumed_content = 0;
    conn->num_bytes_sent = 0;
    conn->path_info = (char *)0x0;
    conn->must_close = 0;
    conn->accept_gzip = 0;
    conn->status_code = -1;
    conn->throttle = 0;
    conn->content_len = -1;
    conn->is_chunked = 0;
    conn->request_len = 0;
    conn->request_state = 0;
    (conn->request_info).content_length = -1;
    (conn->response_info).content_length = -1;
    (conn->request_info).http_version = (char *)0x0;
    (conn->request_info).num_headers = 0;
    (conn->response_info).num_headers = 0;
    (conn->response_info).status_code = 0;
    (conn->request_info).remote_user = (char *)0x0;
    (conn->request_info).request_method = (char *)0x0;
    (conn->request_info).request_uri = (char *)0x0;
    (conn->response_info).status_text = (char *)0x0;
    (conn->response_info).http_version = (char *)0x0;
    pcVar5 = (conn->request_info).local_uri;
    piVar3 = err;
    if (pcVar5 != (conn->request_info).local_uri_raw) {
      free(pcVar5);
      (conn->request_info).local_uri = (char *)0x0;
    }
    (conn->request_info).local_uri = (char *)0x0;
    clock_gettime(1,(timespec *)&conn->req_time);
    pcVar5 = conn->buf;
    iVar4 = conn->buf_size;
    local_48.tv_sec = 0;
    local_48.tv_nsec = 0;
    pcVar1 = conn->dom_ctx->config[0xb];
    __nptr = "30000";
    if (pcVar1 != (char *)0x0) {
      __nptr = pcVar1;
    }
    dVar6 = strtod(__nptr,(char **)0x0);
    if ((0 < conn->handled_requests) && (pcVar1 = conn->dom_ctx->config[0xc], pcVar1 != (char *)0x0)
       ) {
      dVar6 = strtod(pcVar1,(char **)0x0);
    }
    dVar6 = dVar6 / 1000.0;
    iVar2 = get_http_header_len(pcVar5,conn->data_len);
    do {
      if (iVar2 != 0) {
        conn->request_len = iVar2;
        iVar4 = conn->data_len;
        if (iVar2 < 0) goto LAB_0011e954;
        if (iVar2 <= iVar4) {
          return 1;
        }
        mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s","Invalid message size");
        iVar4 = 500;
        goto LAB_0011e99c;
      }
      if (conn->phys_ctx->stop_flag != 0) break;
      iVar2 = conn->data_len;
      if (iVar4 <= iVar2) {
        iVar4 = -2;
        goto LAB_0011e943;
      }
      iVar2 = pull_inner((FILE *)conn,(mg_connection *)(pcVar5 + iVar2),
                         (char *)(ulong)(uint)(iVar4 - iVar2),(int)piVar3,dVar6);
      if (iVar2 == -2) break;
      clock_gettime(1,&local_48);
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      else {
        iVar2 = iVar2 + conn->data_len;
        conn->data_len = iVar2;
        iVar2 = get_http_header_len(pcVar5,iVar2);
      }
    } while (((iVar2 != 0) || (dVar6 < 0.0)) ||
            (piVar3 = (int *)(local_48.tv_sec - (conn->req_time).tv_sec),
            (double)(local_48.tv_nsec - (conn->req_time).tv_nsec) * 1e-09 + (double)(long)piVar3 <=
            dVar6));
    iVar4 = -1;
LAB_0011e943:
    conn->request_len = iVar4;
    iVar4 = conn->data_len;
LAB_0011e954:
    if (iVar4 < 1) {
      conn->must_close = 1;
      iVar4 = 0;
      pcVar5 = "No data received";
    }
    else {
      iVar4 = 400;
      pcVar5 = "Malformed message";
    }
    mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s",pcVar5);
  }
LAB_0011e99c:
  *err = iVar4;
  return 0;
}

Assistant:

static int
get_message(struct mg_connection *conn, char *ebuf, size_t ebuf_len, int *err)
{
	if (ebuf_len > 0) {
		ebuf[0] = '\0';
	}
	*err = 0;

	reset_per_request_attributes(conn);

	if (!conn) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Internal error");
		*err = 500;
		return 0;
	}

	/* Set the time the request was received. This value should be used for
	 * timeouts. */
	clock_gettime(CLOCK_MONOTONIC, &(conn->req_time));

	conn->request_len =
	    read_message(NULL, conn, conn->buf, conn->buf_size, &conn->data_len);
	DEBUG_ASSERT(conn->request_len < 0 || conn->data_len >= conn->request_len);
	if ((conn->request_len >= 0) && (conn->data_len < conn->request_len)) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Invalid message size");
		*err = 500;
		return 0;
	}

	if ((conn->request_len == 0) && (conn->data_len == conn->buf_size)) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Message too large");
		*err = 413;
		return 0;
	}

	if (conn->request_len <= 0) {
		if (conn->data_len > 0) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Malformed message");
			*err = 400;
		} else {
			/* Server did not recv anything -> just close the connection */
			conn->must_close = 1;
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "No data received");
			*err = 0;
		}
		return 0;
	}
	return 1;
}